

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void fe_sq_tl(fe *h,fe_loose *f)

{
  int iVar1;
  uint local_20;
  uint local_1c;
  uint _assert_fe_i_1;
  uint _assert_fe_i;
  fe_loose *f_local;
  fe *h_local;
  
  local_1c = 0;
  while( true ) {
    if (4 < local_1c) {
      fiat_25519_carry_square(h->v,f->v);
      local_20 = 0;
      while( true ) {
        if (4 < local_20) {
          return;
        }
        iVar1 = constant_time_declassify_int((uint)(h->v[local_20] < 0x8cccccccccccd));
        if (iVar1 == 0) break;
        local_20 = local_20 + 1;
      }
      __assert_fail("constant_time_declassify_int(h->v[_assert_fe_i] <= 0x8ccccccccccccUL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                    ,0xf6,"void fe_sq_tl(fe *, const fe_loose *)");
    }
    iVar1 = constant_time_declassify_int((uint)(f->v[local_1c] < 0x1a666666666665));
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  __assert_fail("constant_time_declassify_int(f->v[_assert_fe_i] <= 0x1a666666666664UL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/curve25519.cc"
                ,0xf4,"void fe_sq_tl(fe *, const fe_loose *)");
}

Assistant:

static void fe_sq_tl(fe *h, const fe_loose *f) {
  assert_fe_loose(f->v);
  fiat_25519_carry_square(h->v, f->v);
  assert_fe(h->v);
}